

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_prime.c
# Opt level: O0

int bn_is_prime_int(BIGNUM *w,int checks,BN_CTX *ctx,int do_trial_division,BN_GENCB *cb)

{
  int iVar1;
  BIGNUM *b;
  ulong uVar2;
  int in_ECX;
  BN_CTX *in_RDX;
  int in_ESI;
  BIGNUM *in_RDI;
  BN_GENCB *in_R8;
  int unaff_retaddr;
  BIGNUM *in_stack_00000008;
  unsigned_long mod;
  int trial_divisions;
  BN_CTX *ctxlocal;
  int ret;
  int status;
  int i;
  unsigned_long in_stack_ffffffffffffff98;
  BN_CTX *local_48;
  uint local_3c;
  int local_38;
  int local_34;
  BIGNUM *a;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_3c = 0xffffffff;
  local_48 = (BN_CTX *)0x0;
  a = in_RDI;
  b = BN_value_one();
  iVar1 = BN_cmp(in_RDI,b);
  if (iVar1 < 1) {
    local_3c = 0;
  }
  else {
    iVar1 = BN_is_odd((BIGNUM *)a);
    if (iVar1 == 0) {
      local_3c = BN_is_word((BIGNUM *)in_RDI,in_stack_ffffffffffffff98);
    }
    else {
      iVar1 = BN_is_word((BIGNUM *)in_RDI,in_stack_ffffffffffffff98);
      if (iVar1 == 0) {
        if (in_ECX != 0) {
          iVar1 = BN_num_bits(a);
          iVar1 = calc_trial_divisions(iVar1);
          for (local_34 = 1; local_34 < iVar1; local_34 = local_34 + 1) {
            uVar2 = BN_mod_word(a,(ulong)primes[local_34]);
            if (uVar2 == 0xffffffffffffffff) {
              return -1;
            }
            if (uVar2 == 0) {
              iVar1 = BN_is_word((BIGNUM *)in_RDI,in_stack_ffffffffffffff98);
              return iVar1;
            }
          }
          iVar1 = BN_GENCB_call(in_R8,1,-1);
          if (iVar1 == 0) {
            return -1;
          }
        }
        if ((in_RDX != (BN_CTX *)0x0) ||
           (local_48 = BN_CTX_new(), in_RDX = local_48, local_48 != (BN_CTX *)0x0)) {
          iVar1 = ossl_bn_miller_rabin_is_prime
                            (in_stack_00000008,unaff_retaddr,
                             (BN_CTX *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             ,(BN_GENCB *)a,in_ESI,(int *)in_RDX);
          if (iVar1 == 0) {
            local_3c = 0;
          }
          else {
            local_3c = (uint)(local_38 == 3);
          }
        }
        BN_CTX_free(local_48);
      }
      else {
        local_3c = 1;
      }
    }
  }
  return local_3c;
}

Assistant:

static int bn_is_prime_int(const BIGNUM *w, int checks, BN_CTX *ctx,
                           int do_trial_division, BN_GENCB *cb)
{
    int i, status, ret = -1;
#ifndef FIPS_MODULE
    BN_CTX *ctxlocal = NULL;
#else

    if (ctx == NULL)
        return -1;
#endif

    /* w must be bigger than 1 */
    if (BN_cmp(w, BN_value_one()) <= 0)
        return 0;

    /* w must be odd */
    if (BN_is_odd(w)) {
        /* Take care of the really small prime 3 */
        if (BN_is_word(w, 3))
            return 1;
    } else {
        /* 2 is the only even prime */
        return BN_is_word(w, 2);
    }

    /* first look for small factors */
    if (do_trial_division) {
        int trial_divisions = calc_trial_divisions(BN_num_bits(w));

        for (i = 1; i < trial_divisions; i++) {
            BN_ULONG mod = BN_mod_word(w, primes[i]);
            if (mod == (BN_ULONG)-1)
                return -1;
            if (mod == 0)
                return BN_is_word(w, primes[i]);
        }
        if (!BN_GENCB_call(cb, 1, -1))
            return -1;
    }
#ifndef FIPS_MODULE
    if (ctx == NULL && (ctxlocal = ctx = BN_CTX_new()) == NULL)
        goto err;
#endif

    ret = ossl_bn_miller_rabin_is_prime(w, checks, ctx, cb, 0, &status);
    if (!ret)
        goto err;
    ret = (status == BN_PRIMETEST_PROBABLY_PRIME);
err:
#ifndef FIPS_MODULE
    BN_CTX_free(ctxlocal);
#endif
    return ret;
}